

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O2

void Eigen::internal::
     dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_-1,_2,_1,_-1,_2>_>,_Eigen::internal::evaluator<Eigen::Ref<const_Eigen::Matrix<double,_-1,_2,_1,_-1,_2>,_0,_Eigen::OuterStride<-1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_2,_1>
     ::run(generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,__1,_2,_1,__1,_2>_>,_Eigen::internal::evaluator<Eigen::Ref<const_Eigen::Matrix<double,__1,_2,_1,__1,_2>,_0,_Eigen::OuterStride<_1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
           *kernel)

{
  long outer;
  long lVar1;
  
  lVar1 = (kernel->m_dstExpr->super_PlainObjectBase<Eigen::Matrix<double,__1,_2,_1,__1,_2>_>).
          m_storage.m_rows;
  outer = 0;
  if (lVar1 < 1) {
    lVar1 = outer;
  }
  for (; lVar1 != outer; outer = outer + 1) {
    copy_using_evaluator_innervec_InnerUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_-1,_2,_1,_-1,_2>_>,_Eigen::internal::evaluator<Eigen::Ref<const_Eigen::Matrix<double,_-1,_2,_1,_-1,_2>,_0,_Eigen::OuterStride<-1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_2,_0,_16>
    ::run(kernel,outer);
  }
  return;
}

Assistant:

void run(Kernel &kernel)
  {
    typedef typename Kernel::DstEvaluatorType::XprType DstXprType;
    typedef typename Kernel::AssignmentTraits Traits;
    const Index outerSize = kernel.outerSize();
    for(Index outer = 0; outer < outerSize; ++outer)
      copy_using_evaluator_innervec_InnerUnrolling<Kernel, 0, DstXprType::InnerSizeAtCompileTime,
                                                   Traits::SrcAlignment, Traits::DstAlignment>::run(kernel, outer);
  }